

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  size_t sVar1;
  ImGuiTextRange *pIVar2;
  ImGuiTextRange *pIVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  ImGuiTextRange input_range;
  char *pcVar7;
  
  iVar5 = 0;
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(&this->Filters,0);
  sVar1 = strlen(this->InputBuf);
  input_range.e = this->InputBuf + sVar1;
  input_range.b = this->InputBuf;
  ImGuiTextRange::split(&input_range,',',&this->Filters);
  this->CountGrep = 0;
  pIVar2 = (this->Filters).Data;
  pIVar3 = pIVar2 + (this->Filters).Size;
  for (; pIVar2 != pIVar3; pIVar2 = pIVar2 + 1) {
    pcVar4 = pIVar2->b;
    pcVar7 = pIVar2->e;
    while ((pcVar4 < pcVar7 && ((*pcVar4 == ' ' || (*pcVar4 == '\t'))))) {
      pcVar4 = pcVar4 + 1;
      pIVar2->b = pcVar4;
    }
    while ((pcVar6 = pcVar7 + -1, pcVar4 < pcVar7 && ((*pcVar6 == ' ' || (*pcVar6 == '\t'))))) {
      pIVar2->e = pcVar6;
      pcVar7 = pcVar6;
    }
    if ((pcVar7 != pcVar4) && (*pcVar4 != '-')) {
      iVar5 = iVar5 + 1;
      this->CountGrep = iVar5;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (ImGuiTextRange& f : Filters)
    {
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (f.b[0] != '-')
            CountGrep += 1;
    }
}